

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

ProcessorProperty * __thiscall soul::heart::Parser::parseProcessorProperty(Parser *this)

{
  bool bVar1;
  Property PVar2;
  Module *pMVar3;
  ProcessorProperty *pPVar4;
  CompileMessage local_d0;
  CompileMessage local_98;
  string local_50;
  Property local_2c;
  undefined1 local_28 [4];
  Property property;
  CodeLocation pos;
  Parser *this_local;
  
  pos.location.data = ".";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x548358);
  CodeLocation::CodeLocation
            ((CodeLocation *)local_28,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  readGeneralIdentifier_abi_cxx11_(&local_50,this);
  PVar2 = ProcessorProperty::getPropertyFromName(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_2c = PVar2;
  if (PVar2 == none) {
    Errors::unknownProperty<>();
    CodeLocation::throwError((CodeLocation *)local_28,&local_98);
  }
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  bVar1 = Module::isNamespace(pMVar3);
  if (!bVar1) {
    pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
    pPVar4 = Module::
             allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                       (pMVar3,(CodeLocation *)local_28,&local_2c);
    CodeLocation::~CodeLocation((CodeLocation *)local_28);
    return pPVar4;
  }
  Errors::processorPropertyUsedOutsideDecl<>();
  CodeLocation::throwError((CodeLocation *)local_28,&local_d0);
}

Assistant:

heart::ProcessorProperty& parseProcessorProperty()
    {
        expect (HEARTOperator::dot);
        auto pos = location;
        auto property = heart::ProcessorProperty::getPropertyFromName (readGeneralIdentifier());

        if (property == heart::ProcessorProperty::Property::none)
            pos.throwError (Errors::unknownProperty());

        if (module->isNamespace())
            pos.throwError (Errors::processorPropertyUsedOutsideDecl());

        return module->allocate<heart::ProcessorProperty> (pos, property);
    }